

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O2

size_t PAL_GetLogicalProcessorCacheSizeFromOS(void)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  
  sysconf(0xbc);
  uVar1 = sysconf(0xbc);
  uVar2 = sysconf(0xb9);
  if (uVar1 <= uVar2) {
    uVar1 = sysconf(0xb9);
  }
  uVar2 = sysconf(0xbf);
  if (uVar1 <= uVar2) {
    uVar1 = sysconf(0xbf);
  }
  uVar2 = sysconf(0xc2);
  if (uVar1 <= uVar2) {
    uVar1 = sysconf(0xc2);
  }
  uVar2 = sysconf(0xc5);
  if (uVar2 < uVar1) {
    return uVar1;
  }
  sVar3 = sysconf(0xc5);
  return sVar3;
}

Assistant:

size_t
PALAPI
PAL_GetLogicalProcessorCacheSizeFromOS()
{
    size_t cacheSize = 0;

#if HAVE_SYSCONF && defined(__LINUX__) && !defined(__ANDROID__)
    cacheSize = max(cacheSize, sysconf(_SC_LEVEL1_DCACHE_SIZE));
    cacheSize = max(cacheSize, sysconf(_SC_LEVEL1_ICACHE_SIZE));
    cacheSize = max(cacheSize, sysconf(_SC_LEVEL2_CACHE_SIZE));
    cacheSize = max(cacheSize, sysconf(_SC_LEVEL3_CACHE_SIZE));
    cacheSize = max(cacheSize, sysconf(_SC_LEVEL4_CACHE_SIZE));
#endif

    return cacheSize;
}